

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

void singlesocket(Curl_multi *multi,SessionHandle *data)

{
  connectdata *conn;
  uint uVar1;
  bool bVar2;
  curl_hash *h;
  _Bool _Var3;
  uint uVar4;
  uint uVar5;
  undefined8 *p;
  void *pvVar6;
  long *plVar7;
  ulong uVar8;
  curl_llist_element *pcVar9;
  int in_EDX;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  curl_socket_t s;
  curl_socket_t socks [5];
  int local_60;
  int local_5c;
  Curl_multi *local_58;
  curl_hash *local_50;
  curl_socket_t local_48 [6];
  
  local_48[0] = -1;
  local_48[1] = 0xffffffff;
  local_48[2] = 0xffffffff;
  local_48[3] = 0xffffffff;
  local_48[4] = 0xffffffff;
  uVar4 = multi_getsock(data,local_48,in_EDX);
  local_50 = &multi->sockhash;
  uVar12 = 0;
  local_58 = multi;
  do {
    h = local_50;
    if ((uVar4 >> ((byte)uVar12 & 0x1f) & 0x10001) == 0) goto LAB_00480a33;
    local_60 = local_48[uVar12];
    p = (undefined8 *)Curl_hash_pick(local_50,&local_60,4);
    uVar10 = uVar4 >> ((byte)uVar12 & 0x1f);
    uVar5 = uVar10 & 1;
    uVar1 = uVar5 + 2;
    if ((uVar10 >> 0x10 & 1) == 0) {
      uVar1 = uVar5;
    }
    if (p == (undefined8 *)0x0) {
      local_5c = local_60;
      p = (undefined8 *)Curl_hash_pick(h,&local_5c,4);
      if (p == (undefined8 *)0x0) {
        p = (undefined8 *)(*Curl_ccalloc)(1,0x18);
        if (p == (undefined8 *)0x0) {
          return;
        }
        *p = data;
        *(int *)((long)p + 0xc) = local_5c;
        pvVar6 = Curl_hash_add(local_50,&local_5c,4,p);
        if (pvVar6 == (void *)0x0) {
          (*Curl_cfree)(p);
          return;
        }
      }
LAB_004809f5:
      if (local_58->socket_cb != (curl_socket_callback)0x0) {
        (*local_58->socket_cb)(data,local_60,uVar1,local_58->socket_userp,(void *)p[2]);
      }
      *(uint *)(p + 1) = uVar1;
    }
    else if (*(uint *)(p + 1) != uVar1) goto LAB_004809f5;
    uVar12 = uVar12 + 1;
  } while (uVar12 != 5);
  uVar12 = 5;
LAB_00480a33:
  if (0 < data->numsocks) {
    lVar11 = 0;
    do {
      local_60 = data->sockets[lVar11];
      if ((int)uVar12 != 0) {
        uVar8 = 0;
        do {
          if (local_60 == local_48[uVar8]) {
            local_60 = -1;
            goto LAB_00480b57;
          }
          uVar8 = uVar8 + 1;
        } while ((uVar12 & 0xffffffff) != uVar8);
      }
      if ((local_60 != -1) &&
         (plVar7 = (long *)Curl_hash_pick(local_50,&local_60,4), plVar7 != (long *)0x0)) {
        conn = data->easy_conn;
        if (conn == (connectdata *)0x0) {
LAB_00480b25:
          if (local_58->socket_cb != (curl_socket_callback)0x0) {
            (*local_58->socket_cb)(data,local_60,4,local_58->socket_userp,(void *)plVar7[2]);
          }
          sh_delentry(local_50,local_60);
        }
        else {
          bVar2 = true;
          if ((conn->recv_pipe != (curl_llist *)0x0) && (1 < conn->recv_pipe->size)) {
            if ((SessionHandle *)*plVar7 == data) {
              _Var3 = Curl_recvpipe_head(data,conn);
              pcVar9 = conn->recv_pipe->head;
              if (_Var3) {
                pcVar9 = pcVar9->next;
              }
              *plVar7 = (long)pcVar9->ptr;
            }
            bVar2 = false;
          }
          if ((conn->send_pipe == (curl_llist *)0x0) || (conn->send_pipe->size < 2)) {
            if (bVar2) goto LAB_00480b25;
          }
          else if ((SessionHandle *)*plVar7 == data) {
            _Var3 = Curl_sendpipe_head(data,conn);
            pcVar9 = conn->send_pipe->head;
            if (_Var3) {
              pvVar6 = pcVar9->next->ptr;
            }
            else {
              pvVar6 = pcVar9->ptr;
            }
            *plVar7 = (long)pvVar6;
          }
        }
      }
LAB_00480b57:
      lVar11 = lVar11 + 1;
    } while (lVar11 < data->numsocks);
  }
  memcpy(data->sockets,local_48,(uVar12 & 0xffffffff) << 2);
  data->numsocks = (int)uVar12;
  return;
}

Assistant:

static void singlesocket(struct Curl_multi *multi,
                         struct SessionHandle *data)
{
  curl_socket_t socks[MAX_SOCKSPEREASYHANDLE];
  int i;
  struct Curl_sh_entry *entry;
  curl_socket_t s;
  int num;
  unsigned int curraction;
  bool remove_sock_from_hash;

  for(i=0; i< MAX_SOCKSPEREASYHANDLE; i++)
    socks[i] = CURL_SOCKET_BAD;

  /* Fill in the 'current' struct with the state as it is now: what sockets to
     supervise and for what actions */
  curraction = multi_getsock(data, socks, MAX_SOCKSPEREASYHANDLE);

  /* We have 0 .. N sockets already and we get to know about the 0 .. M
     sockets we should have from now on. Detect the differences, remove no
     longer supervised ones and add new ones */

  /* walk over the sockets we got right now */
  for(i=0; (i< MAX_SOCKSPEREASYHANDLE) &&
        (curraction & (GETSOCK_READSOCK(i) | GETSOCK_WRITESOCK(i)));
      i++) {
    int action = CURL_POLL_NONE;

    s = socks[i];

    /* get it from the hash */
    entry = Curl_hash_pick(&multi->sockhash, (char *)&s, sizeof(s));

    if(curraction & GETSOCK_READSOCK(i))
      action |= CURL_POLL_IN;
    if(curraction & GETSOCK_WRITESOCK(i))
      action |= CURL_POLL_OUT;

    if(entry) {
      /* yeps, already present so check if it has the same action set */
      if(entry->action == action)
        /* same, continue */
        continue;
    }
    else {
      /* this is a socket we didn't have before, add it! */
      entry = sh_addentry(&multi->sockhash, s, data);
      if(!entry)
        /* fatal */
        return;
    }

    /* we know (entry != NULL) at this point, see the logic above */
    if(multi->socket_cb)
      multi->socket_cb(data,
                       s,
                       action,
                       multi->socket_userp,
                       entry->socketp);

    entry->action = action; /* store the current action state */
  }

  num = i; /* number of sockets */

  /* when we've walked over all the sockets we should have right now, we must
     make sure to detect sockets that are removed */
  for(i=0; i< data->numsocks; i++) {
    int j;
    s = data->sockets[i];
    for(j=0; j<num; j++) {
      if(s == socks[j]) {
        /* this is still supervised */
        s = CURL_SOCKET_BAD;
        break;
      }
    }
    if(s != CURL_SOCKET_BAD) {

      /* this socket has been removed. Tell the app to remove it */
      remove_sock_from_hash = TRUE;

      entry = Curl_hash_pick(&multi->sockhash, (char *)&s, sizeof(s));
      if(entry) {
        /* check if the socket to be removed serves a connection which has
           other easy-s in a pipeline. In this case the socket should not be
           removed. */
        struct connectdata *easy_conn = data->easy_conn;
        if(easy_conn) {
          if(easy_conn->recv_pipe && easy_conn->recv_pipe->size > 1) {
            /* the handle should not be removed from the pipe yet */
            remove_sock_from_hash = FALSE;

            /* Update the sockhash entry to instead point to the next in line
               for the recv_pipe, or the first (in case this particular easy
               isn't already) */
            if(entry->easy == data) {
              if(Curl_recvpipe_head(data, easy_conn))
                entry->easy = easy_conn->recv_pipe->head->next->ptr;
              else
                entry->easy = easy_conn->recv_pipe->head->ptr;
            }
          }
          if(easy_conn->send_pipe  && easy_conn->send_pipe->size > 1) {
            /* the handle should not be removed from the pipe yet */
            remove_sock_from_hash = FALSE;

            /* Update the sockhash entry to instead point to the next in line
               for the send_pipe, or the first (in case this particular easy
               isn't already) */
            if(entry->easy == data) {
              if(Curl_sendpipe_head(data, easy_conn))
                entry->easy = easy_conn->send_pipe->head->next->ptr;
              else
                entry->easy = easy_conn->send_pipe->head->ptr;
            }
          }
          /* Don't worry about overwriting recv_pipe head with send_pipe_head,
             when action will be asked on the socket (see multi_socket()), the
             head of the correct pipe will be taken according to the
             action. */
        }
      }
      else
        /* just a precaution, this socket really SHOULD be in the hash already
           but in case it isn't, we don't have to tell the app to remove it
           either since it never got to know about it */
        remove_sock_from_hash = FALSE;

      if(remove_sock_from_hash) {
        /* in this case 'entry' is always non-NULL */
        if(multi->socket_cb)
          multi->socket_cb(data,
                           s,
                           CURL_POLL_REMOVE,
                           multi->socket_userp,
                           entry->socketp);
        sh_delentry(&multi->sockhash, s);
      }

    }
  }

  memcpy(data->sockets, socks, num*sizeof(curl_socket_t));
  data->numsocks = num;
}